

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  bool bVar1;
  char *message;
  PositionType minPosition;
  PositionType maxPosition;
  AssertionResult gtest_ar;
  FactorType newFactor;
  ParticleType particle;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 *local_50;
  Particle local_48;
  
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (&local_48,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,minPosition,
             maxPosition);
  local_50 = &DAT_40b97b8a3d70a3d7;
  local_48.factor = (FactorType)&DAT_40b97b8a3d70a3d7;
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_40b97b8a3d70a3d7;
  testing::internal::CmpHelperEQ<double,double>
            (local_60,"newFactor","particle.getFactor()",(double *)&local_50,(double *)&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetFactor) 
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle = this->randomParticle();
    FactorType newFactor = 6523.54;
    particle.setFactor(newFactor);
    ASSERT_EQ(newFactor, particle.getFactor());
}